

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_expect(mpc_parser_t *a,char *expected)

{
  mpc_parser_t *pmVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RSI;
  char *in_RDI;
  mpc_parser_t *p;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x05';
  (pmVar1->data).fail.m = in_RDI;
  sVar2 = strlen(in_RSI);
  pvVar3 = malloc(sVar2 + 1);
  (pmVar1->data).lift.x = pvVar3;
  strcpy((pmVar1->data).expect.m,in_RSI);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_expect(mpc_parser_t *a, const char *expected) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_EXPECT;
  p->data.expect.x = a;
  p->data.expect.m = malloc(strlen(expected) + 1);
  strcpy(p->data.expect.m, expected);
  return p;
}